

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.c
# Opt level: O2

uint32_t upb_MiniTable_GetSubList(upb_MiniTable *m,upb_MiniTableField **subs)

{
  ushort uVar1;
  upb_CType uVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  int i;
  ulong uVar6;
  upb_MiniTableField *f;
  
  lVar5 = 0;
  iVar4 = 0;
  for (uVar6 = 0; uVar1 = m->field_count_dont_copy_me__upb_internal_use_only, uVar6 < uVar1;
      uVar6 = uVar6 + 1) {
    f = (upb_MiniTableField *)
        ((long)&m->fields_dont_copy_me__upb_internal_use_only->
                number_dont_copy_me__upb_internal_use_only + lVar5);
    uVar2 = upb_MiniTableField_CType(f);
    if (uVar2 == kUpb_CType_Message) {
      *subs = f;
      subs = subs + 1;
      iVar4 = iVar4 + 1;
    }
    lVar5 = lVar5 + 0xc;
  }
  uVar3 = 0;
  for (lVar5 = 0; (ulong)uVar1 * 0xc - lVar5 != 0; lVar5 = lVar5 + 0xc) {
    if ((&m->fields_dont_copy_me__upb_internal_use_only->
          descriptortype_dont_copy_me__upb_internal_use_only)[lVar5] == '\x0e') {
      *subs = (upb_MiniTableField *)
              ((long)&m->fields_dont_copy_me__upb_internal_use_only->
                      number_dont_copy_me__upb_internal_use_only + lVar5);
      subs = subs + 1;
      uVar3 = uVar3 + 1;
    }
  }
  return uVar3 | iVar4 << 0x10;
}

Assistant:

uint32_t upb_MiniTable_GetSubList(const upb_MiniTable* m,
                                  const upb_MiniTableField** subs) {
  uint32_t msg_count = 0;
  uint32_t enum_count = 0;

  for (int i = 0; i < upb_MiniTable_FieldCount(m); i++) {
    const upb_MiniTableField* f = upb_MiniTable_GetFieldByIndex(m, i);
    if (upb_MiniTableField_CType(f) == kUpb_CType_Message) {
      *subs = f;
      ++subs;
      msg_count++;
    }
  }

  for (int i = 0; i < upb_MiniTable_FieldCount(m); i++) {
    const upb_MiniTableField* f = upb_MiniTable_GetFieldByIndex(m, i);
    if (upb_MiniTableField_IsClosedEnum(f)) {
      *subs = f;
      ++subs;
      enum_count++;
    }
  }

  return (msg_count << 16) | enum_count;
}